

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O2

void __thiscall TCLAP::Arg::trimFlag(Arg *this,string *flag,string *value)

{
  int i;
  ulong uVar1;
  string local_40 [32];
  
  uVar1 = 0;
  while( true ) {
    if (flag->_M_string_length == uVar1) {
      return;
    }
    if ((flag->_M_dataplus)._M_p[uVar1] == delimiterRef()::delim) break;
    uVar1 = uVar1 + 1;
  }
  if (uVar1 < 2) {
    return;
  }
  std::__cxx11::string::substr((ulong)local_40,(ulong)flag);
  std::__cxx11::string::operator=((string *)value,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::substr((ulong)local_40,(ulong)flag);
  std::__cxx11::string::operator=((string *)flag,local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

inline void Arg::trimFlag(std::string& flag, std::string& value) const
{
	int stop = 0;
	for ( int i = 0; static_cast<unsigned int>(i) < flag.length(); i++ )
		if ( flag[i] == Arg::delimiter() )
		{
			stop = i;
			break;
		}

	if ( stop > 1 )
	{
		value = flag.substr(stop+1);
		flag = flag.substr(0,stop);
	}

}